

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O1

void __thiscall S2CellUnion::Expand(S2CellUnion *this,int expand_level)

{
  vector<S2CellId,_std::allocator<S2CellId>_> *ids;
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  vector<S2CellId,_std::allocator<S2CellId>_> output;
  S2CellId id;
  vector<S2CellId,_std::allocator<S2CellId>_> local_58;
  S2CellId local_40;
  S2CellUnion *local_38;
  
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ids = &this->cell_ids_;
  uVar7 = (ulong)((long)(this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  local_38 = this;
  if (0 < (int)uVar7) {
    do {
      local_40.id_ = (ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)uVar7 + -1].id_;
      if ((-local_40.id_ & local_40.id_) >> ((char)expand_level * -2 + 0x3cU & 0x3f) == 0) {
        local_40 = S2CellId::parent(&local_40,expand_level);
        uVar6 = uVar7 & 0xffffffff;
        do {
          if ((long)(uVar6 - 1) < 1) {
            uVar7 = 0;
            break;
          }
          bVar5 = S2CellId::contains(&local_40,
                                     (S2CellId)
                                     (ids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>).
                                     _M_impl.super__Vector_impl_data._M_start[uVar6 - 2].id_);
          uVar7 = (ulong)((int)uVar7 - 1);
          uVar6 = uVar6 - 1;
        } while (bVar5);
      }
      else {
        uVar7 = (ulong)((int)uVar7 - 1);
      }
      if (local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                  ((vector<S2CellId,std::allocator<S2CellId>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_40);
      }
      else {
        (local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_finish)->id_ = local_40.id_;
        local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      S2CellId::AppendAllNeighbors(&local_40,expand_level,&local_58);
    } while (0 < (int)uVar7);
  }
  pSVar4 = local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pSVar3 = local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar2 = local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pSVar1 = (local_38->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  (local_38->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_start = pSVar2;
  (local_38->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar3;
  (local_38->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pSVar4;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1);
  }
  Normalize(ids);
  if (local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2CellUnion::Pack(int excess) {
  if (cell_ids_.capacity() - cell_ids_.size() > excess) {
    cell_ids_.shrink_to_fit();
  }
}